

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

void __thiscall llvm::DWARFDebugNames::dump(DWARFDebugNames *this,raw_ostream *OS)

{
  const_iterator pNVar1;
  NameIndex *NI;
  const_iterator __end1;
  const_iterator __begin1;
  SmallVector<llvm::DWARFDebugNames::NameIndex,_0U> *__range1;
  ScopedPrinter W;
  raw_ostream *OS_local;
  DWARFDebugNames *this_local;
  
  W.Prefix.Length = (size_t)OS;
  ScopedPrinter::ScopedPrinter((ScopedPrinter *)&__range1,OS);
  __end1 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::begin
                     ((SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void> *)
                      &this->NameIndices);
  pNVar1 = SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>::end
                     ((SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void> *)
                      &this->NameIndices);
  for (; __end1 != pNVar1; __end1 = __end1 + 1) {
    NameIndex::dump(__end1,(ScopedPrinter *)&__range1);
  }
  return;
}

Assistant:

LLVM_DUMP_METHOD void DWARFDebugNames::dump(raw_ostream &OS) const {
  ScopedPrinter W(OS);
  for (const NameIndex &NI : NameIndices)
    NI.dump(W);
}